

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcaf_grammar_char(mpc_val_t *x,void *s)

{
  byte bVar1;
  char *__ptr;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  
  __ptr = (char *)mpcf_unescape_new(x,"\a\b\f\n\r\t\v\\\'\"",mpc_escape_output_c);
  free(x);
  bVar1 = *(byte *)((long)s + 0x18);
  pmVar2 = mpc_char(*__ptr);
  if ((bVar1 & 2) == 0) {
    pmVar3 = mpc_blank();
    pmVar2 = mpc_and(2,mpcf_fst,pmVar2,pmVar3,mpcf_dtor_null);
  }
  free(__ptr);
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->name = (char *)0x0;
  pmVar3->type = '\x0f';
  pmVar3->retained = '\0';
  (pmVar3->data).expect.x = pmVar2;
  (pmVar3->data).apply.f = mpcf_str_ast;
  pmVar2 = (mpc_parser_t *)calloc(1,0x38);
  pmVar2->name = (char *)0x0;
  pmVar2->type = '\x10';
  pmVar2->retained = '\0';
  (pmVar2->data).expect.x = pmVar3;
  (pmVar2->data).apply.f = mpc_ast_tag;
  (pmVar2->data).check.f = (mpc_check_t)"char";
  pmVar2 = mpca_state(pmVar2);
  return pmVar2;
}

Assistant:

static mpc_val_t *mpcaf_grammar_char(mpc_val_t *x, void *s) {
  mpca_grammar_st_t *st = s;
  char *y = mpcf_unescape(x);
  mpc_parser_t *p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_char(y[0]) : mpc_tok(mpc_char(y[0]));
  free(y);
  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "char"));
}